

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O0

IOTHUB_CLIENT_RESULT
IoTHubClientCore_LL_SetRetryPolicy
          (IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle,IOTHUB_CLIENT_RETRY_POLICY retryPolicy,
          size_t retryTimeoutLimitInSeconds)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  char *pcVar3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *handleData;
  IOTHUB_CLIENT_RESULT result;
  size_t retryTimeoutLimitInSeconds_local;
  IOTHUB_CLIENT_RETRY_POLICY retryPolicy_local;
  IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle_local;
  
  if (iotHubClientHandle == (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0) {
    handleData._4_4_ = IOTHUB_CLIENT_INVALID_ARG;
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      pcVar3 = IOTHUB_CLIENT_RESULTStrings(IOTHUB_CLIENT_INVALID_ARG);
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"IoTHubClientCore_LL_SetRetryPolicy",0x8a1,1,"result = %s",pcVar3);
    }
  }
  else if (iotHubClientHandle->transportHandle == (TRANSPORT_LL_HANDLE)0x0) {
    handleData._4_4_ = IOTHUB_CLIENT_ERROR;
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      pcVar3 = IOTHUB_CLIENT_RESULTStrings(IOTHUB_CLIENT_ERROR);
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"IoTHubClientCore_LL_SetRetryPolicy",0x8a8,1,"result = %s",pcVar3);
    }
  }
  else {
    iVar1 = (*iotHubClientHandle->IoTHubTransport_SetRetryPolicy)
                      (iotHubClientHandle->transportHandle,retryPolicy,retryTimeoutLimitInSeconds);
    if (iVar1 == 0) {
      iotHubClientHandle->retryPolicy = retryPolicy;
      iotHubClientHandle->retryTimeoutLimitInSeconds = retryTimeoutLimitInSeconds;
      handleData._4_4_ = IOTHUB_CLIENT_OK;
    }
    else {
      handleData._4_4_ = IOTHUB_CLIENT_ERROR;
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        pcVar3 = IOTHUB_CLIENT_RESULTStrings(IOTHUB_CLIENT_ERROR);
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                  ,"IoTHubClientCore_LL_SetRetryPolicy",0x8af,1,"result = %s",pcVar3);
      }
    }
  }
  return handleData._4_4_;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubClientCore_LL_SetRetryPolicy(IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle, IOTHUB_CLIENT_RETRY_POLICY retryPolicy, size_t retryTimeoutLimitInSeconds)
{
    IOTHUB_CLIENT_RESULT result;
    IOTHUB_CLIENT_CORE_LL_HANDLE_DATA* handleData = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA*)iotHubClientHandle;

    if (handleData == NULL)
    {
        result = IOTHUB_CLIENT_INVALID_ARG;
        LOG_ERROR_RESULT;
    }
    else
    {
        if (handleData->transportHandle == NULL)
        {
            result = IOTHUB_CLIENT_ERROR;
            LOG_ERROR_RESULT;
        }
        else
        {
            if (handleData->IoTHubTransport_SetRetryPolicy(handleData->transportHandle, retryPolicy, retryTimeoutLimitInSeconds) != 0)
            {
                result = IOTHUB_CLIENT_ERROR;
                LOG_ERROR_RESULT;
            }
            else
            {
                handleData->retryPolicy = retryPolicy;
                handleData->retryTimeoutLimitInSeconds = retryTimeoutLimitInSeconds;
                result = IOTHUB_CLIENT_OK;
            }
        }
    }
    return result;
}